

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::fuse_innerproduct_activation(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  pointer ppLVar3;
  Layer *pLVar4;
  long *plVar5;
  undefined4 *puVar6;
  string *psVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  Mat local_88;
  string *local_40;
  long local_38;
  
  pvVar1 = (this->super_ModelWriter).layers;
  lVar13 = (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar13 != 0) {
    uVar14 = lVar13 >> 3;
    lVar13 = uVar14 + (uVar14 == 0);
    lVar12 = 0;
    local_38 = lVar13;
    do {
      iVar8 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar12]->type);
      if (iVar8 == 0) {
        uVar11 = lVar12 + 1;
        if (uVar11 < uVar14) {
          iVar8 = *((((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar12]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            iVar9 = std::__cxx11::string::compare
                              ((char *)&(((this->super_ModelWriter).layers)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar11]->type);
            if (((((iVar9 == 0) ||
                  (iVar9 = std::__cxx11::string::compare
                                     ((char *)&(((this->super_ModelWriter).layers)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar11]->
                                               type), iVar9 == 0)) ||
                 (iVar9 = std::__cxx11::string::compare
                                    ((char *)&(((this->super_ModelWriter).layers)->
                                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar11]->
                                              type), iVar9 == 0)) ||
                ((iVar9 = std::__cxx11::string::compare
                                    ((char *)&(((this->super_ModelWriter).layers)->
                                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar11]->
                                              type), iVar9 == 0 ||
                 (iVar9 = std::__cxx11::string::compare
                                    ((char *)&(((this->super_ModelWriter).layers)->
                                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar11]->
                                              type), iVar9 == 0)))) &&
               ((pLVar2 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar11],
                piVar10 = (pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                (long)(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar10 == 4 &&
                (lVar13 = local_38, *piVar10 == iVar8)))) goto LAB_00136835;
            uVar11 = uVar11 + 1;
            lVar13 = local_38;
          } while (uVar11 < uVar14);
        }
        else {
LAB_00136835:
          if (uVar11 != uVar14) {
            ppLVar3 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar2 = ppLVar3[lVar12];
            pLVar4 = ppLVar3[uVar11];
            fprintf(_stderr,"fuse_innerproduct_activation %s %s\n",(pLVar2->name)._M_dataplus._M_p);
            local_40 = &pLVar4->type;
            iVar8 = std::__cxx11::string::compare((char *)local_40);
            psVar7 = local_40;
            if (iVar8 == 0) {
              if ((*(float *)&pLVar4[1]._vptr_Layer != 0.0) ||
                 (NAN(*(float *)&pLVar4[1]._vptr_Layer))) {
                pLVar2[1].support_tensor_storage = true;
                pLVar2[1].support_reserved_00 = false;
                pLVar2[1].support_reserved_0 = false;
                pLVar2[1].support_reserved_1 = false;
                local_88.cstep = 0;
                local_88.data = (void *)0x0;
                local_88.refcount._0_4_ = 0;
                local_88.refcount._4_4_ = 0;
                local_88.elemsize._0_4_ = 0;
                local_88.elemsize._4_4_ = 0;
                local_88.elempack = 0;
                local_88.h = 0;
                local_88.d = 0;
                local_88.c = 0;
                local_88.allocator = (Allocator *)0x0;
                local_88.dims = 0;
                local_88.w = 0;
                ncnn::Mat::create(&local_88,1,4,(Allocator *)0x0);
                piVar10 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                if ((Mat *)&pLVar2[1].support_reserved_6 != &local_88) {
                  if (piVar10 != (int *)0x0) {
                    LOCK();
                    *piVar10 = *piVar10 + 1;
                    UNLOCK();
                  }
                  piVar10 = (int *)pLVar2[1].userdata;
                  if (piVar10 != (int *)0x0) {
                    LOCK();
                    *piVar10 = *piVar10 + -1;
                    UNLOCK();
                    if (*piVar10 == 0) {
                      plVar5 = (long *)pLVar2[1].type._M_string_length;
                      if (plVar5 == (long *)0x0) {
                        if (*(void **)&pLVar2[1].support_reserved_6 != (void *)0x0) {
                          free(*(void **)&pLVar2[1].support_reserved_6);
                        }
                      }
                      else {
                        (**(code **)(*plVar5 + 0x18))();
                      }
                    }
                  }
                  *(void **)&pLVar2[1].support_reserved_6 = local_88.data;
                  piVar10 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                  pLVar2[1].userdata = piVar10;
                  *(ulong *)&pLVar2[1].typeindex =
                       CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                  *(int *)&pLVar2[1].type._M_dataplus._M_p = local_88.elempack;
                  pLVar2[1].type._M_string_length = (size_type)local_88.allocator;
                  *(int *)&pLVar2[1].type.field_2 = local_88.dims;
                  *(int *)((long)&pLVar2[1].type.field_2 + 4) = local_88.w;
                  *(int *)((long)&pLVar2[1].type.field_2 + 8) = local_88.h;
                  *(int *)((long)&pLVar2[1].type.field_2 + 0xc) = local_88.d;
                  *(int *)&pLVar2[1].name._M_dataplus._M_p = local_88.c;
                  pLVar2[1].name._M_string_length = local_88.cstep;
                }
                if (piVar10 != (int *)0x0) {
                  LOCK();
                  *piVar10 = *piVar10 + -1;
                  UNLOCK();
                  if (*piVar10 == 0) {
                    if (local_88.allocator == (Allocator *)0x0) {
                      if (local_88.data != (void *)0x0) {
                        free(local_88.data);
                      }
                    }
                    else {
                      (*(local_88.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                **(undefined4 **)&pLVar2[1].support_reserved_6 =
                     *(undefined4 *)&pLVar4[1]._vptr_Layer;
              }
              else {
                pLVar2[1].support_tensor_storage = true;
                pLVar2[1].support_reserved_00 = false;
                pLVar2[1].support_reserved_0 = false;
                pLVar2[1].support_reserved_1 = false;
              }
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)local_40);
              if (iVar8 == 0) {
                pLVar2[1].support_tensor_storage = true;
                pLVar2[1].support_reserved_00 = false;
                pLVar2[1].support_reserved_0 = false;
                pLVar2[1].support_reserved_1 = false;
                local_88.cstep = 0;
                local_88.data = (void *)0x0;
                local_88.refcount._0_4_ = 0;
                local_88.refcount._4_4_ = 0;
                local_88.elemsize._0_4_ = 0;
                local_88.elemsize._4_4_ = 0;
                local_88.elempack = 0;
                local_88.h = 0;
                local_88.d = 0;
                local_88.c = 0;
                local_88.allocator = (Allocator *)0x0;
                local_88.dims = 0;
                local_88.w = 0;
                ncnn::Mat::create(&local_88,2,4,(Allocator *)0x0);
                piVar10 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                if ((Mat *)&pLVar2[1].support_reserved_6 != &local_88) {
                  if (piVar10 != (int *)0x0) {
                    LOCK();
                    *piVar10 = *piVar10 + 1;
                    UNLOCK();
                  }
                  piVar10 = (int *)pLVar2[1].userdata;
                  if (piVar10 != (int *)0x0) {
                    LOCK();
                    *piVar10 = *piVar10 + -1;
                    UNLOCK();
                    if (*piVar10 == 0) {
                      plVar5 = (long *)pLVar2[1].type._M_string_length;
                      if (plVar5 == (long *)0x0) {
                        if (*(void **)&pLVar2[1].support_reserved_6 != (void *)0x0) {
                          free(*(void **)&pLVar2[1].support_reserved_6);
                        }
                      }
                      else {
                        (**(code **)(*plVar5 + 0x18))();
                      }
                    }
                  }
                  *(void **)&pLVar2[1].support_reserved_6 = local_88.data;
                  piVar10 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                  pLVar2[1].userdata = piVar10;
                  *(ulong *)&pLVar2[1].typeindex =
                       CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                  *(int *)&pLVar2[1].type._M_dataplus._M_p = local_88.elempack;
                  pLVar2[1].type._M_string_length = (size_type)local_88.allocator;
                  *(int *)&pLVar2[1].type.field_2 = local_88.dims;
                  *(int *)((long)&pLVar2[1].type.field_2 + 4) = local_88.w;
                  *(int *)((long)&pLVar2[1].type.field_2 + 8) = local_88.h;
                  *(int *)((long)&pLVar2[1].type.field_2 + 0xc) = local_88.d;
                  *(int *)&pLVar2[1].name._M_dataplus._M_p = local_88.c;
                  pLVar2[1].name._M_string_length = local_88.cstep;
                }
                if (piVar10 != (int *)0x0) {
                  LOCK();
                  *piVar10 = *piVar10 + -1;
                  UNLOCK();
                  if (*piVar10 == 0) {
                    if (local_88.allocator == (Allocator *)0x0) {
LAB_00136daf:
                      if (local_88.data != (void *)0x0) {
                        free(local_88.data);
                      }
                    }
                    else {
                      (*(local_88.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
LAB_00136dc6:
                puVar6 = *(undefined4 **)&pLVar2[1].support_reserved_6;
                *puVar6 = *(undefined4 *)&pLVar4[1]._vptr_Layer;
                puVar6[1] = *(undefined4 *)((long)&pLVar4[1]._vptr_Layer + 4);
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)psVar7);
                if (iVar8 == 0) {
                  pLVar2[1].support_tensor_storage = true;
                  pLVar2[1].support_reserved_00 = false;
                  pLVar2[1].support_reserved_0 = false;
                  pLVar2[1].support_reserved_1 = false;
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)psVar7);
                  if (iVar8 == 0) {
                    pLVar2[1].support_tensor_storage = true;
                    pLVar2[1].support_reserved_00 = false;
                    pLVar2[1].support_reserved_0 = false;
                    pLVar2[1].support_reserved_1 = false;
                  }
                  else {
                    iVar8 = std::__cxx11::string::compare((char *)psVar7);
                    if (iVar8 == 0) {
                      pLVar2[1].support_tensor_storage = true;
                      pLVar2[1].support_reserved_00 = false;
                      pLVar2[1].support_reserved_0 = false;
                      pLVar2[1].support_reserved_1 = false;
                      local_88.cstep = 0;
                      local_88.data = (void *)0x0;
                      local_88.refcount._0_4_ = 0;
                      local_88.refcount._4_4_ = 0;
                      local_88.elemsize._0_4_ = 0;
                      local_88.elemsize._4_4_ = 0;
                      local_88.elempack = 0;
                      local_88.h = 0;
                      local_88.d = 0;
                      local_88.c = 0;
                      local_88.allocator = (Allocator *)0x0;
                      local_88.dims = 0;
                      local_88.w = 0;
                      ncnn::Mat::create(&local_88,2,4,(Allocator *)0x0);
                      piVar10 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                      if ((Mat *)&pLVar2[1].support_reserved_6 != &local_88) {
                        if (piVar10 != (int *)0x0) {
                          LOCK();
                          *piVar10 = *piVar10 + 1;
                          UNLOCK();
                        }
                        piVar10 = (int *)pLVar2[1].userdata;
                        if (piVar10 != (int *)0x0) {
                          LOCK();
                          *piVar10 = *piVar10 + -1;
                          UNLOCK();
                          if (*piVar10 == 0) {
                            plVar5 = (long *)pLVar2[1].type._M_string_length;
                            if (plVar5 == (long *)0x0) {
                              if (*(void **)&pLVar2[1].support_reserved_6 != (void *)0x0) {
                                free(*(void **)&pLVar2[1].support_reserved_6);
                              }
                            }
                            else {
                              (**(code **)(*plVar5 + 0x18))();
                            }
                          }
                        }
                        *(void **)&pLVar2[1].support_reserved_6 = local_88.data;
                        piVar10 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                        pLVar2[1].userdata = piVar10;
                        *(ulong *)&pLVar2[1].typeindex =
                             CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                        *(int *)&pLVar2[1].type._M_dataplus._M_p = local_88.elempack;
                        pLVar2[1].type._M_string_length = (size_type)local_88.allocator;
                        *(int *)&pLVar2[1].type.field_2 = local_88.dims;
                        *(int *)((long)&pLVar2[1].type.field_2 + 4) = local_88.w;
                        *(int *)((long)&pLVar2[1].type.field_2 + 8) = local_88.h;
                        *(int *)((long)&pLVar2[1].type.field_2 + 0xc) = local_88.d;
                        *(int *)&pLVar2[1].name._M_dataplus._M_p = local_88.c;
                        pLVar2[1].name._M_string_length = local_88.cstep;
                      }
                      if (piVar10 != (int *)0x0) {
                        LOCK();
                        *piVar10 = *piVar10 + -1;
                        UNLOCK();
                        if (*piVar10 == 0) {
                          if (local_88.allocator == (Allocator *)0x0) goto LAB_00136daf;
                          (*(local_88.allocator)->_vptr_Allocator[3])();
                        }
                      }
                      goto LAB_00136dc6;
                    }
                  }
                }
              }
            }
            iVar8 = *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar8;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar8].producer = (int)lVar12;
            std::__cxx11::string::_M_replace
                      ((ulong)local_40,0,(char *)(pLVar4->type)._M_string_length,0x5b119a);
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar13);
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_innerproduct_activation()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - Activation
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid" && layers[j]->type != "Mish" && layers[j]->type != "HardSwish")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse InnerProduct - Activation to InnerProduct
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_innerproduct_activation %s %s\n", innerproduct->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                innerproduct->activation_type = 1;
            }
            else
            {
                innerproduct->activation_type = 2;
                innerproduct->activation_params = ncnn::Mat(1);
                innerproduct->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            innerproduct->activation_type = 3;
            innerproduct->activation_params = ncnn::Mat(2);
            innerproduct->activation_params[0] = clip->min;
            innerproduct->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            innerproduct->activation_type = 4;
        }
        else if (activation->type == "Mish")
        {
            innerproduct->activation_type = 5;
        }
        else if (activation->type == "HardSwish")
        {
            ncnn::HardSwish* hardswish = (ncnn::HardSwish*)activation;

            innerproduct->activation_type = 6;
            innerproduct->activation_params = ncnn::Mat(2);
            innerproduct->activation_params[0] = hardswish->alpha;
            innerproduct->activation_params[1] = hardswish->beta;
        }

        int top_blob_index_final = activation->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}